

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void __thiscall
module_secondary_csv_actions::module_adds(module_secondary_csv_actions *this,string *module)

{
  ostream *poVar1;
  string *module_local;
  module_secondary_csv_actions *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&this->secondary_);
  poVar1 = std::operator<<(poVar1,(string *)&s_csv_separator_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,(string *)module);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void module_adds( std::string const & module )
    {
        std::cout << secondary_ << s_csv_separator << module << "\n";
    }